

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::
Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_1,_-1,_false>,_1,_-1,_false>
::Block(Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>,_1,__1,_false>
        *this,Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>
              *xpr,Index a_startRow,Index a_startCol,Index blockRows,Index blockCols)

{
  internal::
  BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_1,_-1,_false>,_1,_-1,_false,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>,_1,__1,_false,_true>
                     *)this,xpr,a_startRow,a_startCol,blockRows,blockCols);
  if (blockRows != 1) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/Block.h"
                  ,0x8b,
                  "Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, 1>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  if ((((-1 < a_startRow) && (a_startRow == 0)) && (-1 < (blockCols | a_startCol))) &&
     (a_startCol <=
      (xpr->
      super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false,_Eigen::Dense>
      ).
      super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1,__1,_false>,_0>
      .m_cols.m_value - blockCols)) {
    return;
  }
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/Block.h"
                ,0x8d,
                "Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, 1>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

inline Block(XprType& xpr,
          Index a_startRow, Index a_startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, a_startRow, a_startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(a_startRow >= 0 && blockRows >= 0 && a_startRow  <= xpr.rows() - blockRows
          && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols);
    }